

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O0

void __thiscall QtMWidgets::MsgBoxButton::paintEvent(MsgBoxButton *this,QPaintEvent *param_1)

{
  QPalette *pQVar1;
  MsgBoxButtonPrivate *pMVar2;
  QColor *pQVar3;
  QRect local_b0;
  QBrush local_a0 [8];
  undefined8 uStack_98;
  QColor c;
  QFlags<Qt::AlignmentFlag> local_7c;
  QTextOption local_78 [24];
  QRect local_60;
  QRectF local_50;
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *param_1_local;
  MsgBoxButton *this_local;
  
  _p = param_1;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  pQVar1 = (QPalette *)QWidget::palette();
  QPalette::color(pQVar1,WindowText);
  QPainter::setPen((QColor *)local_20);
  local_60 = QWidget::rect((QWidget *)this);
  QRectF::QRectF(&local_50,&local_60);
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxButtonPrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxButtonPrivate>_>
           ::operator->(&this->d);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_7c,AlignCenter);
  QTextOption::QTextOption(local_78,(QFlags_conflict1 *)(ulong)local_7c.i);
  QPainter::drawText((QRectF *)local_20,(QString *)&local_50,(QTextOption *)&pMVar2->text);
  QTextOption::~QTextOption(local_78);
  pMVar2 = QScopedPointer<QtMWidgets::MsgBoxButtonPrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxButtonPrivate>_>
           ::operator->(&this->d);
  if ((pMVar2->pressed & 1U) != 0) {
    pQVar1 = (QPalette *)QWidget::palette();
    pQVar3 = QPalette::color(pQVar1,Highlight);
    uStack_98 = *(undefined8 *)pQVar3;
    c._0_8_ = *(undefined8 *)((long)&pQVar3->ct + 4);
    QColor::setAlpha((int)&uStack_98);
    QPainter::setPen((PenStyle)local_20);
    QBrush::QBrush(local_a0,(QColor *)&uStack_98,SolidPattern);
    QPainter::setBrush((QBrush *)local_20);
    QBrush::~QBrush(local_a0);
    local_b0 = QWidget::rect((QWidget *)this);
    QPainter::drawRect(local_20,&local_b0);
  }
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void
MsgBoxButton::paintEvent( QPaintEvent * )
{
	QPainter p( this );

	p.setPen( palette().color( QPalette::WindowText ) );

	p.drawText( rect(), d->text, QTextOption( Qt::AlignCenter ) );

	if( d->pressed )
	{
		QColor c = palette().color( QPalette::Highlight );
		c.setAlpha( 75 );

		p.setPen( Qt::NoPen );
		p.setBrush( c );
		p.drawRect( rect() );
	}
}